

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raassignment_p.h
# Opt level: O2

void __thiscall
asmjit::v1_14::RAAssignment::assign
          (RAAssignment *this,RegGroup group,uint32_t workId,uint32_t physId,bool dirty)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint **ppuVar4;
  uint *puVar5;
  size_t siglen;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  undefined3 in_register_00000081;
  undefined4 uVar6;
  undefined4 in_register_00000084;
  size_t in_R9;
  uint uVar7;
  RegGroup group_local;
  
  uVar6 = CONCAT31(in_register_00000081,dirty);
  group_local = group;
  uVar3 = workToPhysId(this,group,workId);
  if (uVar3 != 0xff) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/raassignment_p.h"
               ,0xd3,"workToPhysId(group, workId) == kPhysNone");
  }
  uVar3 = physToWorkId(this,group,physId);
  if (uVar3 != 0xffffffff) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/raassignment_p.h"
               ,0xd4,"physToWorkId(group, physId) == kWorkNone");
  }
  bVar2 = isPhysAssigned(this,group,physId);
  if (bVar2) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/raassignment_p.h"
               ,0xd5,"!isPhysAssigned(group, physId)");
  }
  bVar2 = isPhysDirty(this,group,physId);
  if (!bVar2) {
    this->_workToPhysMap[workId].physIds[0] = (byte)physId;
    ctx = (EVP_PKEY_CTX *)&group_local;
    ppuVar4 = Support::Array<unsigned_int_*,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                        (&this->_physToWorkIds,(RegGroup *)ctx);
    (*ppuVar4)[physId] = workId;
    siglen = (size_t)physId;
    uVar7 = 1 << ((byte)physId & 0x1f);
    puVar5 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<unsigned_int,_4UL> *)this->_physToWorkMap,(RegGroup *)ctx);
    *puVar5 = *puVar5 | uVar7;
    uVar1 = 0;
    if (dirty) {
      uVar1 = uVar7;
    }
    puVar5 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       (&(this->_physToWorkMap->dirty)._masks,(RegGroup *)ctx);
    *puVar5 = *puVar5 | uVar1;
    verify(this,ctx,sig,siglen,(uchar *)CONCAT44(in_register_00000084,uVar6),in_R9);
    return;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/raassignment_p.h"
             ,0xd6,"!isPhysDirty(group, physId)");
}

Assistant:

inline void assign(RegGroup group, uint32_t workId, uint32_t physId, bool dirty) noexcept {
    ASMJIT_ASSERT(workToPhysId(group, workId) == kPhysNone);
    ASMJIT_ASSERT(physToWorkId(group, physId) == kWorkNone);
    ASMJIT_ASSERT(!isPhysAssigned(group, physId));
    ASMJIT_ASSERT(!isPhysDirty(group, physId));

    _workToPhysMap->physIds[workId] = uint8_t(physId);
    _physToWorkIds[group][physId] = workId;

    RegMask regMask = Support::bitMask(physId);
    _physToWorkMap->assigned[group] |= regMask;
    _physToWorkMap->dirty[group] |= regMask & Support::bitMaskFromBool<RegMask>(dirty);

    verify();
  }